

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int add_resolve_entry(JSContext *ctx,JSResolveState *s,JSModuleDef *m,JSAtom name)

{
  long lVar1;
  int iVar2;
  JSAtom JVar3;
  undefined8 *puVar4;
  JSAtom in_ECX;
  JSContext *in_RDX;
  JSContext *in_RSI;
  JSResolveEntry *re;
  int in_stack_ffffffffffffffcc;
  int *in_stack_ffffffffffffffd0;
  int local_4;
  
  iVar2 = js_resize_array(in_RSI,(void **)in_RDX,in_ECX,in_stack_ffffffffffffffd0,
                          in_stack_ffffffffffffffcc);
  if (iVar2 == 0) {
    lVar1 = *(long *)&in_RSI->header;
    iVar2 = *(int *)((long)&(in_RSI->header).link.prev + 4);
    *(int *)((long)&(in_RSI->header).link.prev + 4) = iVar2 + 1;
    puVar4 = (undefined8 *)(lVar1 + (long)iVar2 * 0x10);
    *puVar4 = in_RDX;
    JVar3 = JS_DupAtom(in_RDX,in_ECX);
    *(JSAtom *)(puVar4 + 1) = JVar3;
    local_4 = 0;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int add_resolve_entry(JSContext *ctx, JSResolveState *s,
                             JSModuleDef *m, JSAtom name)
{
    JSResolveEntry *re;

    if (js_resize_array(ctx, (void **)&s->array,
                        sizeof(JSResolveEntry),
                        &s->size, s->count + 1))
        return -1;
    re = &s->array[s->count++];
    re->module = m;
    re->name = JS_DupAtom(ctx, name);
    return 0;
}